

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O0

void __thiscall
stateObservation::AlgebraicSensor::setState(AlgebraicSensor *this,Vector *state,TimeIndex k)

{
  TimeIndex this_00;
  int iVar1;
  undefined4 extraout_var;
  Type local_90;
  Type local_58;
  TimeIndex local_20;
  TimeIndex k_local;
  Vector *state_local;
  AlgebraicSensor *this_local;
  
  local_20 = k;
  k_local = (TimeIndex)state;
  state_local = (Vector *)this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
            (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)state,this->concat_);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->directInputToOutput_,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_58);
  this_00 = k_local;
  iVar1 = (*(this->super_SensorBase)._vptr_SensorBase[0xe])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_90,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             CONCAT44(extraout_var,iVar1));
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->state_,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_90);
  this->storedNoisyMeasurement_ = false;
  this->storedNoiselessMeasurement_ = false;
  this->time_ = local_20;
  return;
}

Assistant:

void AlgebraicSensor::setState(const Vector & state, TimeIndex k)
{
  directInputToOutput_ = state.tail(concat_);
  state_ = state.head(getStateSize_());
  storedNoisyMeasurement_ = false;
  storedNoiselessMeasurement_ = false;

  time_ = k;
}